

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanHppGenerator.cpp
# Opt level: O0

string * __thiscall
VulkanHppGenerator::generateDataDeclarations
          (string *__return_storage_ptr__,VulkanHppGenerator *this,CommandData *commandData,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *returnParams,
          map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
          *vectorParams,
          set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
          *templatedParams,CommandFlavourFlags flavourFlags,bool raii,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *dataTypes,string *dataType,string *returnType,string *returnVariable)

{
  bool bVar1;
  size_type sVar2;
  size_type sVar3;
  CommandFlavourFlagBits local_6b [2];
  Flags<CommandFlavourFlagBits> local_69;
  Flags<CommandFlavourFlagBits> local_68;
  MaskType local_67;
  CommandFlavourFlagBits local_66;
  MaskType local_65;
  allocator<char> local_52;
  byte local_51;
  set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *psStack_50;
  bool raii_local;
  set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
  *templatedParams_local;
  map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
  *vectorParams_local;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *returnParams_local;
  CommandData *commandData_local;
  VulkanHppGenerator *this_local;
  string *psStack_20;
  CommandFlavourFlags flavourFlags_local;
  
  this_local._7_1_ = (CommandFlavourFlags)flavourFlags.m_mask;
  local_51 = raii;
  psStack_50 = templatedParams;
  templatedParams_local =
       (set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)vectorParams;
  vectorParams_local =
       (map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
        *)returnParams;
  returnParams_local = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)commandData;
  commandData_local = (CommandData *)this;
  psStack_20 = __return_storage_ptr__;
  sVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(dataTypes);
  sVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)vectorParams_local);
  if (sVar2 != sVar3) {
    __assert_fail("dataTypes.size() == returnParams.size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp"
                  ,0x1771,
                  "std::string VulkanHppGenerator::generateDataDeclarations(const CommandData &, const std::vector<size_t> &, const std::map<size_t, VectorParamData> &, const std::set<size_t> &, CommandFlavourFlags, bool, const std::vector<std::string> &, const std::string &, const std::string &, const std::string &) const"
                 );
  }
  sVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)vectorParams_local);
  switch(sVar2) {
  case 0:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"",&local_52);
    std::allocator<char>::~allocator(&local_52);
    break;
  case 1:
    local_65 = this_local._7_1_;
    generateDataDeclarations1Return
              (__return_storage_ptr__,this,(CommandData *)returnParams_local,
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *)vectorParams_local,
               (map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
                *)templatedParams_local,psStack_50,this_local._7_1_,dataTypes,dataType,returnType,
               returnVariable);
    break;
  case 2:
    local_66 = unique;
    bVar1 = Flags<CommandFlavourFlagBits>::operator&
                      ((Flags<CommandFlavourFlagBits> *)((long)&this_local + 7),&local_66);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      __assert_fail("!( flavourFlags & CommandFlavourFlagBits::unique )",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp"
                    ,0x177a,
                    "std::string VulkanHppGenerator::generateDataDeclarations(const CommandData &, const std::vector<size_t> &, const std::map<size_t, VectorParamData> &, const std::set<size_t> &, CommandFlavourFlags, bool, const std::vector<std::string> &, const std::string &, const std::string &, const std::string &) const"
                   );
    }
    local_67 = this_local._7_1_;
    generateDataDeclarations2Returns
              (__return_storage_ptr__,this,(CommandData *)returnParams_local,
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *)vectorParams_local,
               (map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
                *)templatedParams_local,this_local._7_1_,(bool)(local_51 & 1),dataTypes,dataType,
               returnVariable);
    break;
  case 3:
    local_6b[1] = 4;
    local_6b[0] = unique;
    local_69.m_mask = (MaskType)operator|(local_6b + 1,local_6b);
    local_68 = Flags<CommandFlavourFlagBits>::operator&
                         ((Flags<CommandFlavourFlagBits> *)((long)&this_local + 7),&local_69);
    bVar1 = Flags<CommandFlavourFlagBits>::operator!(&local_68);
    if (!bVar1) {
      __assert_fail("!( flavourFlags & ( CommandFlavourFlagBits::singular | CommandFlavourFlagBits::unique ) )"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp"
                    ,0x177d,
                    "std::string VulkanHppGenerator::generateDataDeclarations(const CommandData &, const std::vector<size_t> &, const std::map<size_t, VectorParamData> &, const std::set<size_t> &, CommandFlavourFlags, bool, const std::vector<std::string> &, const std::string &, const std::string &, const std::string &) const"
                   );
    }
    generateDataDeclarations3Returns
              (__return_storage_ptr__,this,(CommandData *)returnParams_local,
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *)vectorParams_local,
               (map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
                *)templatedParams_local,this_local._7_1_,(bool)(local_51 & 1),dataTypes);
    break;
  default:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp"
                  ,0x177f,
                  "std::string VulkanHppGenerator::generateDataDeclarations(const CommandData &, const std::vector<size_t> &, const std::map<size_t, VectorParamData> &, const std::set<size_t> &, CommandFlavourFlags, bool, const std::vector<std::string> &, const std::string &, const std::string &, const std::string &) const"
                 );
  }
  return __return_storage_ptr__;
}

Assistant:

std::string VulkanHppGenerator::generateDataDeclarations( CommandData const &                       commandData,
                                                          std::vector<size_t> const &               returnParams,
                                                          std::map<size_t, VectorParamData> const & vectorParams,
                                                          std::set<size_t> const &                  templatedParams,
                                                          CommandFlavourFlags                       flavourFlags,
                                                          bool                                      raii,
                                                          std::vector<std::string> const &          dataTypes,
                                                          std::string const &                       dataType,
                                                          std::string const &                       returnType,
                                                          std::string const &                       returnVariable ) const
{
  assert( dataTypes.size() == returnParams.size() );

  switch ( returnParams.size() )
  {
    case 0: return "";  // no returnParams -> no data declarations
    case 1:
      return generateDataDeclarations1Return(
        commandData, returnParams, vectorParams, templatedParams, flavourFlags, dataTypes, dataType, returnType, returnVariable );
    case 2:
      assert( !( flavourFlags & CommandFlavourFlagBits::unique ) );
      return generateDataDeclarations2Returns( commandData, returnParams, vectorParams, flavourFlags, raii, dataTypes, dataType, returnVariable );
    case 3:
      assert( !( flavourFlags & ( CommandFlavourFlagBits::singular | CommandFlavourFlagBits::unique ) ) );
      return generateDataDeclarations3Returns( commandData, returnParams, vectorParams, flavourFlags, raii, dataTypes );
    default: assert( false ); return "";
  }
}